

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O0

void __thiscall nivalis::Plotter::handle_mouse_down(Plotter *this,int px,int py)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  bool in_stack_000001d6;
  bool in_stack_000001d7;
  int in_stack_000001d8;
  int in_stack_000001dc;
  Plotter *in_stack_000001e0;
  size_t in_stack_000001e8;
  Plotter *in_stack_000001f0;
  
  if (((*(byte *)(in_RDI + 800) & 1) == 0) && ((*(byte *)(in_RDI + 0x321) & 1) == 0)) {
    if ((in_ESI < 0) ||
       (((in_EDX < 0 ||
         (iVar1 = *(int *)(in_RDI + 8),
         sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                           ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                            (in_RDI + 0x298)), sVar2 <= (ulong)(long)(in_EDX * iVar1 + in_ESI))) ||
        (pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                             (in_RDI + 0x298),(long)(in_EDX * *(int *)(in_RDI + 8) + in_ESI)),
        *pvVar3 == 0xffffffffffffffff)))) {
      *(undefined1 *)(in_RDI + 800) = 1;
      *(int *)(in_RDI + 0x324) = in_ESI;
      *(int *)(in_RDI + 0x328) = in_EDX;
      set_curr_func(in_stack_000001f0,in_stack_000001e8);
    }
    else {
      detect_marker_click(in_stack_000001e0,in_stack_000001dc,in_stack_000001d8,in_stack_000001d7,
                          in_stack_000001d6);
      if (*(int *)(in_RDI + 300) == 0) {
        *(undefined1 *)(in_RDI + 0x321) = 1;
      }
      else {
        *(undefined1 *)(in_RDI + 800) = 1;
        *(int *)(in_RDI + 0x324) = in_ESI;
        *(int *)(in_RDI + 0x328) = in_EDX;
      }
    }
  }
  return;
}

Assistant:

void Plotter::handle_mouse_down(int px, int py) {
    if (!drag_view && !drag_trace) {
        if (px >= 0 && py >= 0 &&
                py * view.swid + px < grid.size() &&
                ~grid[py * view.swid + px]) {
            // Show marker and either trace or drag view
            detect_marker_click(px, py, false, true);
            if (passive_marker_click_behavior ==
                    PASSIVE_MARKER_CLICK_DRAG_TRACE) {
                drag_trace = true;
            } else {
                // Drag view
                drag_view = true;
                dragx = px; dragy = py;
            }
        } else {
            // Begin dragging view
            drag_view = true;
            dragx = px; dragy = py;
            set_curr_func(-1);
        }
    }
}